

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O0

void Bitmap_format_Matrix(uint8_t *dst,uint8_t *src)

{
  byte bVar1;
  byte *pbVar2;
  uint32_t local_48;
  uint32_t count;
  uint8_t temp;
  uint8_t *p;
  uint8_t *pdst;
  uint8_t *psrc;
  uint local_20;
  uint32_t k;
  uint32_t j;
  uint32_t i;
  uint8_t *src_local;
  uint8_t *dst_local;
  
  _count = src;
  switch(bmp_BitCount) {
  case '\x01':
    p = dst + bmp_width * bmp_height;
    for (k = 0; k < bmp_height; k = k + 1) {
      p = p + -(ulong)bmp_width;
      local_48 = 0;
      for (local_20 = 0; local_20 < bmp_width + 7 >> 3; local_20 = local_20 + 1) {
        bVar1 = _count[local_20];
        for (psrc._4_4_ = 0; psrc._4_4_ < 8; psrc._4_4_ = psrc._4_4_ + 1) {
          *p = (uint8_t)((int)((uint)bVar1 & 0x80 >> ((byte)psrc._4_4_ & 0x1f)) >>
                        (7 - (byte)psrc._4_4_ & 0x1f));
          local_48 = local_48 + 1;
          p = p + 1;
          if (local_48 == bmp_width) break;
        }
      }
      p = p + -(ulong)bmp_width;
      _count = _count + bytesPerLine;
    }
    break;
  default:
    break;
  case '\x04':
    p = dst + bmp_width * bmp_height;
    for (k = 0; k < bmp_height; k = k + 1) {
      p = p + -(ulong)bmp_width;
      local_48 = 0;
      for (local_20 = 0; pbVar2 = p, local_20 < bmp_width + 1 >> 1; local_20 = local_20 + 1) {
        bVar1 = _count[local_20];
        *p = (uint8_t)((int)(bVar1 & 0xf0) >> 4);
        pbVar2 = p + 1;
        if (local_48 + 1 == bmp_width) break;
        p[1] = bVar1 & 0xf;
        local_48 = local_48 + 2;
        p = p + 2;
        pbVar2 = p;
        if (local_48 == bmp_width) break;
      }
      p = pbVar2;
      p = p + -(ulong)bmp_width;
      _count = _count + bytesPerLine;
    }
    break;
  case '\b':
    p = dst + bmp_width * bmp_height;
    for (k = 0; k < bmp_height; k = k + 1) {
      _count = src + ((ulong)((k + 1) * bytesPerLine) - (ulong)skip);
      for (local_20 = 0; local_20 < bmp_width; local_20 = local_20 + 1) {
        p = p + -1;
        _count = _count + -1;
        *p = *_count;
      }
    }
    break;
  case '\x10':
    p = dst + bmp_width * bmp_height * 2;
    for (k = 0; k < bmp_height; k = k + 1) {
      _count = src + ((ulong)((k + 1) * bytesPerLine) - (ulong)skip);
      for (local_20 = 0; local_20 < bmp_width; local_20 = local_20 + 1) {
        p[-2] = _count[-1];
        p[-1] = _count[-2];
        _count = _count + -2;
        p = p + -2;
      }
    }
    break;
  case '\x18':
    p = dst + bmp_width * bmp_height * 3;
    for (k = 0; k < bmp_height; k = k + 1) {
      _count = src + ((ulong)((k + 1) * bytesPerLine) - (ulong)skip);
      for (local_20 = 0; local_20 < bmp_width; local_20 = local_20 + 1) {
        p[-3] = _count[-1];
        p[-2] = _count[-2];
        p[-1] = _count[-3];
        _count = _count + -3;
        p = p + -3;
      }
    }
    break;
  case ' ':
    p = dst + bmp_width * bmp_height * 4;
    for (k = 0; k < bmp_height; k = k + 1) {
      _count = src + (k + 1) * bmp_width * 4;
      for (local_20 = 0; local_20 < bmp_width; local_20 = local_20 + 1) {
        p[-4] = _count[-2];
        p[-3] = _count[-3];
        p[-2] = _count[-4];
        p[-1] = _count[-1];
        _count = _count + -4;
        p = p + -4;
      }
    }
  }
  return;
}

Assistant:

static void Bitmap_format_Matrix(uint8_t *dst,uint8_t *src)
{
	uint32_t i,j,k;
    uint8_t *psrc = src;
    uint8_t *pdst = dst;
    uint8_t *p = psrc;
	uint8_t temp;
	uint32_t count;
	
	//����bmp�洢�ǴӺ�����ǰ�棬������Ҫ��������ת��
	switch(bmp_BitCount)
	{
		case 1:
			pdst += (bmp_width * bmp_height);
			
			for(i=0;i<bmp_height;i++)
			{
				pdst -= bmp_width;
				count = 0;
				for (j=0;j<(bmp_width+7)/8;j++)
				{
					temp = p[j];
					
					for (k=0;k<8;k++)
					{
						pdst[0]= ((temp & (0x80>>k)) >> (7-k));
						count++;
						pdst++;
						if (count == bmp_width)
						{
							break;
						}
					}
				}
				pdst -= bmp_width;
				p += bytesPerLine;
			}
		break;
		case 4:
			pdst += (bmp_width * bmp_height);

			for(i=0;i<bmp_height;i++)
			{
				pdst -= bmp_width;
				count = 0;
				for (j=0;j<(bmp_width+1)/2;j++)
				{
					temp = p[j];
					pdst[0]= ((temp & 0xf0) >> 4);
					count++;
					pdst++;
					if (count == bmp_width)
					{
						break;
					}

					pdst[0] = temp & 0x0f;
					count++;
					pdst++;
					if (count == bmp_width)
					{
						break;
					}
				}
				pdst -= bmp_width;
				p += bytesPerLine;
			}
		break;
		case 8:
			pdst += (bmp_width*bmp_height);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bytesPerLine;
				p -= skip;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 1;
					p -= 1;
					pdst[0] = p[0];
				}
			}
		break;
		case 16:
			pdst += (bmp_width*bmp_height*2);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bytesPerLine;
				p -= skip;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 2;
					p -= 2;
					pdst[0] = p[1];
					pdst[1] = p[0];
				}
			}
		break;
		case 24:
			pdst += (bmp_width*bmp_height*3);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bytesPerLine;
				p -= skip;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 3;
					p -= 3;
					pdst[0] = p[2];
					pdst[1] = p[1];
					pdst[2] = p[0];
				}
			}
		break;
		case 32:
			pdst += (bmp_width*bmp_height*4);
			for(i=0;i<bmp_height;i++)
			{
				p = psrc+(i+1)*bmp_width*4;
				for(j=0;j<bmp_width;j++)
				{
					pdst -= 4;
					p -= 4;
					pdst[0] = p[2];
					pdst[1] = p[1];
					pdst[2] = p[0];
					pdst[3] = p[3];
				}
			}
		break;
		
		default:
		break;
	}	
}